

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_weakValueDictionary_primitive_atOrNil
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_18;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_18 = 0;
  _Var1 = sysbvm_weakValueDictionary_find(context,*arguments,arguments[1],&local_18);
  if (!_Var1) {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

static sysbvm_tuple_t sysbvm_weakValueDictionary_primitive_atOrNil(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
    if(!sysbvm_weakValueDictionary_find(context, arguments[0], arguments[1], &found))
        found = SYSBVM_NULL_TUPLE;

    return found;
}